

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectile.cpp
# Opt level: O2

void __thiscall
CProjectile::CProjectile
          (CProjectile *this,CGameWorld *pGameWorld,int Type,int Owner,vec2 Pos,vec2 Dir,int Span,
          int Damage,bool Explosive,float Force,int SoundImpact,int Weapon)

{
  CGameWorld *this_00;
  vec2 Pos_00;
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar5;
  undefined8 in_XMM1_Qb;
  undefined1 auVar4 [16];
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_48;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_44;
  float fStack_40;
  float fStack_3c;
  
  uVar1 = -(uint)(0.0 < Pos.field_0.x);
  uVar2 = -(uint)(0.0 < Pos.field_1.y);
  Pos_00.field_1.y = (float)(int)((float)(~uVar2 & 0xbf000000 | uVar2 & 0x3f000000) + Pos.field_1.y)
  ;
  Pos_00.field_0.x = (float)(int)((float)(~uVar1 & 0xbf000000 | uVar1 & 0x3f000000) + Pos.field_0.x)
  ;
  CEntity::CEntity(&this->super_CEntity,pGameWorld,0,Pos_00,0);
  (this->super_CEntity)._vptr_CEntity = (_func_int **)&PTR__CEntity_0015d050;
  this->m_Type = Type;
  local_48 = Dir.field_0;
  aStack_44 = Dir.field_1;
  fStack_40 = (float)in_XMM1_Qb;
  fStack_3c = (float)((ulong)in_XMM1_Qb >> 0x20);
  fVar3 = local_48.x * (float)DAT_00141f70;
  fVar5 = aStack_44.y * DAT_00141f70._4_4_;
  uVar1 = -(uint)(0.0 < fVar3);
  uVar2 = -(uint)(0.0 < fVar5);
  auVar4._0_4_ = (float)(int)((float)(~uVar1 & 0xbf000000 | uVar1 & 0x3f000000) + fVar3);
  auVar4._4_4_ = (float)(int)((float)(~uVar2 & 0xbf000000 | uVar2 & 0x3f000000) + fVar5);
  auVar4._8_4_ = (float)(int)(fStack_40 * DAT_00141f70._8_4_ + 0.0);
  auVar4._12_4_ = (float)(int)(fStack_3c * DAT_00141f70._12_4_ + 0.0);
  auVar4 = divps(auVar4,_DAT_00141f70);
  this->m_Direction = auVar4._0_8_;
  this->m_LifeSpan = Span;
  this->m_Owner = Owner;
  this_00 = (this->super_CEntity).m_pGameWorld;
  this->m_OwnerTeam = this_00->m_pGameServer->m_apPlayers[Owner]->m_Team;
  this->m_Force = Force;
  this->m_Damage = Damage;
  this->m_SoundImpact = SoundImpact;
  this->m_Weapon = Weapon;
  this->m_StartTick = this_00->m_pServer->m_CurrentGameTick;
  this->m_Explosive = Explosive;
  CGameWorld::InsertEntity(this_00,&this->super_CEntity);
  return;
}

Assistant:

CProjectile::CProjectile(CGameWorld *pGameWorld, int Type, int Owner, vec2 Pos, vec2 Dir, int Span,
		int Damage, bool Explosive, float Force, int SoundImpact, int Weapon)
: CEntity(pGameWorld, CGameWorld::ENTTYPE_PROJECTILE, vec2(round_to_int(Pos.x), round_to_int(Pos.y)))
{
	m_Type = Type;
	m_Direction.x = round_to_int(Dir.x*100.0f) / 100.0f;
	m_Direction.y = round_to_int(Dir.y*100.0f) / 100.0f;
	m_LifeSpan = Span;
	m_Owner = Owner;
	m_OwnerTeam = GameServer()->m_apPlayers[Owner]->GetTeam();
	m_Force = Force;
	m_Damage = Damage;
	m_SoundImpact = SoundImpact;
	m_Weapon = Weapon;
	m_StartTick = Server()->Tick();
	m_Explosive = Explosive;

	GameWorld()->InsertEntity(this);
}